

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_EraseIf_Test::Btree_EraseIf_Test(Btree_EraseIf_Test *this)

{
  Btree_EraseIf_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Btree_EraseIf_Test_0079c860;
  return;
}

Assistant:

TEST(Btree, EraseIf) {
        // Test that erase_if works with all the container types and supports lambdas.
        {
            phmap::btree_set<int> s = {1, 3, 5, 6, 100};
            erase_if(s, [](int k) { return k > 3; });
            EXPECT_THAT(s, ElementsAre(1, 3));
        }
        {
            phmap::btree_multiset<int> s = {1, 3, 3, 5, 6, 6, 100};
            erase_if(s, [](int k) { return k <= 3; });
            EXPECT_THAT(s, ElementsAre(5, 6, 6, 100));
        }
        {
            phmap::btree_map<int, int> m = {{1, 1}, {3, 3}, {6, 6}, {100, 100}};
            erase_if(m, [](std::pair<const int, int> kv) { return kv.first > 3; });
            EXPECT_THAT(m, ElementsAre(Pair(1, 1), Pair(3, 3)));
        }
        {
            phmap::btree_multimap<int, int> m = {{1, 1}, {3, 3}, {3, 6},
                                                 {6, 6}, {6, 7}, {100, 6}};
            erase_if(m, [](std::pair<const int, int> kv) { return kv.second == 6; });
            EXPECT_THAT(m, ElementsAre(Pair(1, 1), Pair(3, 3), Pair(6, 7)));
        }
        // Test that erasing all elements from a large set works and test support for
        // function pointers.
        {
            phmap::btree_set<int> s;
            for (int i = 0; i < 1000; ++i) s.insert(2 * i);
            erase_if(s, IsEven);
            EXPECT_THAT(s, IsEmpty());
        }
        // Test that erase_if supports other format of function pointers.
        {
            phmap::btree_set<int> s = {1, 3, 5, 6, 100};
            erase_if(s, &IsEven);
            EXPECT_THAT(s, ElementsAre(1, 3, 5));
        }
    }